

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

int TPZFMatrix<std::complex<float>_>::Error(char *msg1,char *msg2)

{
  ostream *poVar1;
  char *pcVar2;
  char *in_RSI;
  char *in_RDI;
  ostringstream out;
  size_t in_stack_00000248;
  char *in_stack_00000250;
  string local_1b8 [48];
  ostringstream local_188 [376];
  char *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"TPZFMatrix::");
  std::operator<<(poVar1,local_8);
  if (local_10 != (char *)0x0) {
    std::operator<<((ostream *)local_188,local_10);
  }
  std::operator<<((ostream *)local_188,".\n");
  std::__cxx11::ostringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1b8);
  pzinternal::DebugStopImpl(in_stack_00000250,in_stack_00000248);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return 0;
}

Assistant:

int TPZFMatrix<TVar>::Error(const char *msg1,const char *msg2 ) {
    ostringstream out;
    out << "TPZFMatrix::" << msg1;
    if(msg2) out << msg2;
    out << ".\n";
    LOGPZ_ERROR (logger, out.str().c_str());
    DebugStop();
    return 0;
}